

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_sse4.c
# Opt level: O0

__m128i compute_cubic_kernels(double u,double v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong in_XMM0_Qa;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong in_XMM1_Qa;
  undefined1 auVar16 [16];
  __m128i alVar17;
  __m128d k2;
  __m128d k1;
  __m128d k0;
  __m128d x3;
  __m128d x2;
  __m128d x;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_238;
  undefined8 uStack_230;
  __m128i c23;
  __m128i c01;
  __m128i c3;
  __m128i c2;
  __m128i c1;
  __m128i c0;
  __m128d prec;
  __m128d k3;
  
  auVar16._8_8_ = 0;
  auVar16._0_8_ = in_XMM1_Qa;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = in_XMM0_Qa;
  auVar4 = vunpcklpd_avx(auVar9,auVar16);
  local_4e8 = auVar4._0_8_;
  uStack_4e0 = auVar4._8_8_;
  dVar7 = local_4e8 * local_4e8;
  dVar14 = uStack_4e0 * uStack_4e0;
  dVar8 = dVar7 * local_4e8;
  dVar15 = dVar14 * uStack_4e0;
  auVar6._8_8_ = uStack_4e0 * -0.5 + dVar14;
  auVar6._0_8_ = local_4e8 * -0.5 + dVar7;
  auVar4._8_8_ = dVar15 * 0.5;
  auVar4._0_8_ = dVar8 * 0.5;
  auVar4 = vsubpd_avx(auVar6,auVar4);
  auVar5._8_8_ = 0x3ff0000000000000;
  auVar5._0_8_ = 0x3ff0000000000000;
  auVar1._8_8_ = dVar14 * 2.5;
  auVar1._0_8_ = dVar7 * 2.5;
  auVar2 = vsubpd_avx(auVar5,auVar1);
  local_238 = auVar2._0_8_;
  uStack_230 = auVar2._8_8_;
  auVar3._8_8_ = uStack_4e0 * 0.5 + dVar14 * 2.0;
  auVar3._0_8_ = local_4e8 * 0.5 + dVar7 * 2.0;
  auVar2._8_8_ = dVar15 * 1.5;
  auVar2._0_8_ = dVar8 * 1.5;
  auVar3 = vsubpd_avx(auVar3,auVar2);
  local_538 = auVar4._0_8_;
  uStack_530 = auVar4._8_8_;
  auVar10._0_8_ = local_538 * 16384.0;
  auVar10._8_8_ = uStack_530 * 16384.0;
  auVar4 = vroundpd_avx(auVar10,8);
  auVar11._0_8_ = (local_238 + dVar8 * 1.5) * 16384.0;
  auVar11._8_8_ = (uStack_230 + dVar15 * 1.5) * 16384.0;
  auVar2 = vroundpd_avx(auVar11,8);
  local_558 = auVar3._0_8_;
  uStack_550 = auVar3._8_8_;
  auVar12._0_8_ = local_558 * 16384.0;
  auVar12._8_8_ = uStack_550 * 16384.0;
  auVar3 = vroundpd_avx(auVar12,8);
  auVar13._0_8_ = (dVar7 * -0.5 + dVar8 * 0.5) * 16384.0;
  auVar13._8_8_ = (dVar14 * -0.5 + dVar15 * 0.5) * 16384.0;
  auVar1 = vroundpd_avx(auVar13,8);
  auVar4 = vcvtpd2dq_avx(auVar4);
  auVar2 = vcvtpd2dq_avx(auVar2);
  auVar3 = vcvtpd2dq_avx(auVar3);
  auVar1 = vcvtpd2dq_avx(auVar1);
  auVar4 = vpunpckldq_avx(auVar4,auVar2);
  auVar2 = vpunpckldq_avx(auVar3,auVar1);
  vpackssdw_avx(auVar4,auVar2);
  alVar17[1] = 0x3ff8000000000000;
  alVar17[0] = 0x40d0000000000000;
  return alVar17;
}

Assistant:

static inline __m128i compute_cubic_kernels(double u, double v) {
  const __m128d x = _mm_set_pd(v, u);

  const __m128d x2 = _mm_mul_pd(x, x);
  const __m128d x3 = _mm_mul_pd(x2, x);

  // Macro to multiply a value v by a constant coefficient c
#define MULC(c, v) _mm_mul_pd(_mm_set1_pd(c), v)

  // Compute floating-point kernel
  // Note: To ensure results are bit-identical to the C code, we need to perform
  // exactly the same sequence of operations here as in the C code.
  __m128d k0 = _mm_sub_pd(_mm_add_pd(MULC(-0.5, x), x2), MULC(0.5, x3));
  __m128d k1 =
      _mm_add_pd(_mm_sub_pd(_mm_set1_pd(1.0), MULC(2.5, x2)), MULC(1.5, x3));
  __m128d k2 =
      _mm_sub_pd(_mm_add_pd(MULC(0.5, x), MULC(2.0, x2)), MULC(1.5, x3));
  __m128d k3 = _mm_add_pd(MULC(-0.5, x2), MULC(0.5, x3));
#undef MULC

  // Integerize
  __m128d prec = _mm_set1_pd((double)(1 << DISFLOW_INTERP_BITS));

  k0 = _mm_round_pd(_mm_mul_pd(k0, prec),
                    _MM_FROUND_TO_NEAREST_INT | _MM_FROUND_NO_EXC);
  k1 = _mm_round_pd(_mm_mul_pd(k1, prec),
                    _MM_FROUND_TO_NEAREST_INT | _MM_FROUND_NO_EXC);
  k2 = _mm_round_pd(_mm_mul_pd(k2, prec),
                    _MM_FROUND_TO_NEAREST_INT | _MM_FROUND_NO_EXC);
  k3 = _mm_round_pd(_mm_mul_pd(k3, prec),
                    _MM_FROUND_TO_NEAREST_INT | _MM_FROUND_NO_EXC);

  const __m128i c0 = _mm_cvtpd_epi32(k0);
  const __m128i c1 = _mm_cvtpd_epi32(k1);
  const __m128i c2 = _mm_cvtpd_epi32(k2);
  const __m128i c3 = _mm_cvtpd_epi32(k3);

  // Rearrange results and convert down to 16 bits, giving the target output
  // ordering
  const __m128i c01 = _mm_unpacklo_epi32(c0, c1);
  const __m128i c23 = _mm_unpacklo_epi32(c2, c3);
  return _mm_packs_epi32(c01, c23);
}